

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

UBool __thiscall
icu_63::AnnualTimeZoneRule::getPreviousStart
          (AnnualTimeZoneRule *this,UDate base,int32_t prevRawOffset,int32_t prevDSTSavings,
          UBool inclusive,UDate *result)

{
  UBool UVar1;
  int iVar2;
  int32_t year;
  UDate tmp;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int local_5c;
  UDate local_58;
  double local_50;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c;
  int32_t local_38;
  int32_t local_34;
  
  local_58 = base;
  Grego::timeToFields(base,&local_5c,&local_34,&local_38,&local_3c,&local_40,&local_44);
  if (this->fEndYear < local_5c) {
    iVar2 = (*(this->super_TimeZoneRule).super_UObject._vptr_UObject[8])
                      (this,(ulong)(uint)prevRawOffset,(ulong)(uint)prevDSTSavings,result);
    UVar1 = (UBool)iVar2;
  }
  else {
    UVar1 = getStartInYear(this,local_5c,prevRawOffset,prevDSTSavings,&local_50);
    if (UVar1 == '\0') {
      UVar1 = '\0';
    }
    else if ((local_58 < local_50) ||
            (((inclusive == '\0' && (local_50 == local_58)) && (!NAN(local_50) && !NAN(local_58)))))
    {
      UVar1 = getStartInYear(this,local_5c + -1,prevRawOffset,prevDSTSavings,result);
    }
    else {
      *result = local_50;
      UVar1 = '\x01';
    }
  }
  return UVar1;
}

Assistant:

UBool
AnnualTimeZoneRule::getPreviousStart(UDate base,
                                     int32_t prevRawOffset,
                                     int32_t prevDSTSavings,
                                     UBool inclusive,
                                     UDate& result) const {
    int32_t year, month, dom, dow, doy, mid;
    Grego::timeToFields(base, year, month, dom, dow, doy, mid);
    if (year > fEndYear) {
        return getFinalStart(prevRawOffset, prevDSTSavings, result);
    }
    UDate tmp;
    if (getStartInYear(year, prevRawOffset, prevDSTSavings, tmp)) {
        if (tmp > base || (!inclusive && (tmp == base))) {
            // Return the previous one
            return getStartInYear(year - 1, prevRawOffset, prevDSTSavings, result);
        } else {
            result = tmp;
            return TRUE;
        }
    }
    return FALSE;
}